

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_char>,unsigned_char,duckdb::BitXorOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  idx_t iVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar4 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar3 = *(long *)(input + 0x28);
      uVar5 = 0;
      uVar7 = 0;
      do {
        if (lVar3 == 0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = *(ulong *)(lVar3 + uVar5 * 8);
        }
        uVar9 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar9 = count;
        }
        uVar6 = uVar9;
        if (uVar12 != 0) {
          uVar6 = uVar7;
          if (uVar12 == 0xffffffffffffffff) {
            if (uVar7 < uVar9) {
              bVar11 = *state;
              do {
                bVar1 = *(byte *)(lVar4 + uVar6);
                if ((bVar11 & 1) == 0) {
                  state[1] = bVar1;
                  *state = '\x01';
                  bVar11 = 1;
                }
                else {
                  state[1] = state[1] ^ bVar1;
                }
                uVar6 = uVar6 + 1;
              } while (uVar9 != uVar6);
            }
          }
          else if (uVar7 < uVar9) {
            uVar13 = 0;
            do {
              if ((uVar12 >> (uVar13 & 0x3f) & 1) != 0) {
                bVar11 = *(byte *)(lVar4 + uVar7);
                if (*state == '\0') {
                  state[1] = bVar11;
                  *state = '\x01';
                }
                else {
                  state[1] = state[1] ^ bVar11;
                }
              }
              uVar7 = uVar7 + 1;
              uVar13 = uVar13 + 1;
              uVar6 = uVar7;
            } while (uVar9 != uVar7);
          }
        }
        uVar5 = uVar5 + 1;
        uVar7 = uVar6;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if (((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) &&
       (count != 0)) {
      pbVar2 = *(byte **)(input + 0x20);
      do {
        if (*state == '\0') {
          state[1] = *pbVar2;
          *state = '\x01';
        }
        else {
          state[1] = state[1] ^ *pbVar2;
        }
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_58 == 0) {
      if (count != 0) {
        lVar4 = *local_68;
        bVar11 = *state;
        iVar8 = 0;
        do {
          iVar10 = iVar8;
          if (lVar4 != 0) {
            iVar10 = (idx_t)*(uint *)(lVar4 + iVar8 * 4);
          }
          if ((bVar11 & 1) == 0) {
            state[1] = *(byte *)(local_60 + iVar10);
            *state = '\x01';
            bVar11 = 1;
          }
          else {
            state[1] = state[1] ^ *(byte *)(local_60 + iVar10);
          }
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
      }
    }
    else if (count != 0) {
      lVar4 = *local_68;
      iVar8 = 0;
      do {
        iVar10 = iVar8;
        if (lVar4 != 0) {
          iVar10 = (idx_t)*(uint *)(lVar4 + iVar8 * 4);
        }
        if ((*(ulong *)(local_58 + (iVar10 >> 6) * 8) >> (iVar10 & 0x3f) & 1) != 0) {
          if (*state == '\0') {
            state[1] = *(byte *)(local_60 + iVar10);
            *state = '\x01';
          }
          else {
            state[1] = state[1] ^ *(byte *)(local_60 + iVar10);
          }
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}